

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::flattened_access_chain_matrix_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t base,uint32_t *indices,
          uint32_t count,SPIRType *target_type,uint32_t offset,uint32_t matrix_stride,
          bool need_transpose)

{
  uint uVar1;
  uint32_t uVar2;
  string local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  uint32_t *local_188;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_188 = indices;
  if (matrix_stride != 0) {
    SPIRType::SPIRType((SPIRType *)local_180,target_type);
    if (need_transpose) {
      uVar2 = SUB84(local_180._20_8_,4);
      local_180._24_4_ = (uint32_t)local_180._20_8_;
      local_180._20_4_ = uVar2;
    }
    local_190 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_190;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    type_to_glsl_constructor_abi_cxx11_(&local_1b0,this,(SPIRType *)local_180);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_1b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (local_180._24_4_ != 0) {
      uVar1 = 0;
      do {
        if (uVar1 != 0) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        flattened_access_chain_vector_abi_cxx11_
                  (&local_1b0,this,base,local_188,count,(SPIRType *)local_180,offset,matrix_stride,
                   false);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1b0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p);
        }
        uVar1 = uVar1 + 1;
        offset = offset + matrix_stride;
      } while (uVar1 < (uint)local_180._24_4_);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    local_180._0_8_ = &PTR__SPIRType_003f9270;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    local_b8 = 0;
    if (local_c0 != local_a8) {
      free(local_c0);
    }
    local_180._144_8_ = 0;
    if ((TypedID<(spirv_cross::Types)1> *)local_180._136_8_ !=
        (TypedID<(spirv_cross::Types)1> *)(local_180 + 0xa0)) {
      free((void *)local_180._136_8_);
    }
    local_180._96_8_ = 0;
    if ((undefined1 *)local_180._88_8_ != local_180 + 0x70) {
      free((void *)local_180._88_8_);
    }
    local_180._40_8_ = 0;
    if ((undefined1 *)local_180._32_8_ != local_180 + 0x38) {
      free((void *)local_180._32_8_);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("matrix_stride",
                "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp"
                ,0x294b,
                "std::string spirv_cross::CompilerGLSL::flattened_access_chain_matrix(uint32_t, const uint32_t *, uint32_t, const SPIRType &, uint32_t, uint32_t, bool)"
               );
}

Assistant:

std::string CompilerGLSL::flattened_access_chain_matrix(uint32_t base, const uint32_t *indices, uint32_t count,
                                                        const SPIRType &target_type, uint32_t offset,
                                                        uint32_t matrix_stride, bool need_transpose)
{
	assert(matrix_stride);
	SPIRType tmp_type = target_type;
	if (need_transpose)
		swap(tmp_type.vecsize, tmp_type.columns);

	std::string expr;

	expr += type_to_glsl_constructor(tmp_type);
	expr += "(";

	for (uint32_t i = 0; i < tmp_type.columns; i++)
	{
		if (i != 0)
			expr += ", ";

		expr += flattened_access_chain_vector(base, indices, count, tmp_type, offset + i * matrix_stride, matrix_stride,
		                                      /* need_transpose= */ false);
	}

	expr += ")";

	return expr;
}